

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O0

int ReconstructIntra4(VP8EncIterator *it,int16_t *levels,uint8_t *src,uint8_t *yuv_out,int mode)

{
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  int16_t *in_RSI;
  long in_RDI;
  int in_R8D;
  int ctx;
  int y;
  int x;
  int16_t tmp [16];
  int nz;
  VP8SegmentInfo *dqm;
  uint8_t *ref;
  VP8Encoder *enc;
  VP8Matrix *in_stack_00000158;
  int in_stack_00000160;
  int in_stack_00000164;
  int16_t *in_stack_00000168;
  int16_t *in_stack_00000170;
  VP8Encoder *in_stack_00000178;
  int in_stack_00000190;
  int16_t local_68 [18];
  int local_44;
  VP8Matrix *local_40;
  uint8_t *local_38;
  long local_30;
  uint8_t *local_20;
  int16_t *local_10;
  long local_8;
  
  local_30 = *(long *)(in_RDI + 0x28);
  local_38 = (uint8_t *)(*(long *)(in_RDI + 0x20) + (long)(int)(uint)VP8I4ModeOffsets[in_R8D]);
  local_40 = (VP8Matrix *)(local_30 + 0x260 + (ulong)(**(byte **)(in_RDI + 0x30) >> 5 & 3) * 0x2e8);
  local_44 = 0;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  (*VP8FTransform)(in_RDX,local_38,local_68);
  if (*(int *)(local_8 + 0x148) == 0) {
    local_44 = (*VP8EncQuantizeBlock)(local_68,local_10,local_40);
  }
  else {
    local_44 = TrellisQuantizeBlock
                         (in_stack_00000178,in_stack_00000170,in_stack_00000168,in_stack_00000164,
                          in_stack_00000160,in_stack_00000158,in_stack_00000190);
  }
  (*VP8ITransform)(local_38,local_68,local_20,0);
  return local_44;
}

Assistant:

static int ReconstructIntra4(VP8EncIterator* const it,
                             int16_t levels[16],
                             const uint8_t* const src,
                             uint8_t* const yuv_out,
                             int mode) {
  const VP8Encoder* const enc = it->enc_;
  const uint8_t* const ref = it->yuv_p_ + VP8I4ModeOffsets[mode];
  const VP8SegmentInfo* const dqm = &enc->dqm_[it->mb_->segment_];
  int nz = 0;
  int16_t tmp[16];

  VP8FTransform(src, ref, tmp);
  if (DO_TRELLIS_I4 && it->do_trellis_) {
    const int x = it->i4_ & 3, y = it->i4_ >> 2;
    const int ctx = it->top_nz_[x] + it->left_nz_[y];
    nz = TrellisQuantizeBlock(enc, tmp, levels, ctx, TYPE_I4_AC, &dqm->y1_,
                              dqm->lambda_trellis_i4_);
  } else {
    nz = VP8EncQuantizeBlock(tmp, levels, &dqm->y1_);
  }
  VP8ITransform(ref, tmp, yuv_out, 0);
  return nz;
}